

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

Gia_Obj_t * Gia_ObjRoToRi(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  
  iVar2 = Gia_ObjIsRo(p,pObj);
  if (iVar2 != 0) {
    iVar2 = p->vCos->nSize;
    iVar1 = p->vCis->nSize;
    iVar3 = Gia_ObjCioId(pObj);
    pGVar4 = Gia_ManCo(p,(iVar2 - iVar1) + iVar3);
    return pGVar4;
  }
  __assert_fail("Gia_ObjIsRo(p, pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline Gia_Obj_t *  Gia_ObjRoToRi( Gia_Man_t * p, Gia_Obj_t * pObj )    { assert( Gia_ObjIsRo(p, pObj) ); return Gia_ManCo(p, Gia_ManCoNum(p) - Gia_ManCiNum(p) + Gia_ObjCioId(pObj)); }